

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_RoundTrip.c
# Opt level: O0

WJTL_STATUS TestMarshallUnmarshall(void)

{
  _Bool _Var1;
  JL_STATUS JVar2;
  bool Condition;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  StructType newStruct;
  _Bool _result_1;
  char *pcStack_a00;
  _Bool _result;
  char *jsonString;
  StructType theStruct;
  JlMarshallElement marshalStructType [2];
  JlMarshallElement marshalSubStructType [18];
  WJTL_STATUS local_c;
  WJTL_STATUS TestReturn;
  
  local_c = WJTL_STATUS_SUCCESS;
  memcpy(&marshalStructType[1].ChildStructDescriptionCount,&DAT_00150730,0x6c0);
  theStruct.subStructArrayCount._0_4_ = 5;
  marshalStructType[0]._0_8_ = anon_var_dwarf_f8f0;
  marshalStructType[0].Name._0_1_ = 0;
  marshalStructType[0].IsArray = false;
  marshalStructType[0]._17_7_ = 0;
  marshalStructType[0].FieldOffset = 0x78;
  marshalStructType[0].FieldSize = 0;
  marshalStructType[0].CountFieldOffset = 0;
  marshalStructType[0].CountFieldSize = 0;
  marshalStructType[0].ArrayFieldSize = 0;
  marshalStructType[0].ArrayItemSize._0_4_ = 0;
  marshalStructType[0].ArrayItemSize._4_1_ = 0;
  marshalStructType[0].ArrayItemSize._5_1_ = 0;
  marshalStructType[0]._72_8_ = &marshalStructType[1].ChildStructDescriptionCount;
  marshalStructType[0].ChildStructDescription._0_4_ = 0x12;
  marshalStructType[0].ChildStructDescriptionCount = 5;
  marshalStructType[1]._0_8_ = anon_var_dwarf_f8fb;
  marshalStructType[1].Name._0_1_ = 1;
  marshalStructType[1].IsArray = true;
  marshalStructType[1]._17_7_ = 0;
  marshalStructType[1].FieldOffset = 0x1e0;
  marshalStructType[1].FieldSize = 600;
  marshalStructType[1].CountFieldOffset = 8;
  marshalStructType[1].CountFieldSize = 0x1e0;
  marshalStructType[1].ArrayFieldSize = 0x78;
  marshalStructType[1].ArrayItemSize._0_4_ = 0;
  marshalStructType[1].ArrayItemSize._4_1_ = 0;
  marshalStructType[1].ArrayItemSize._5_1_ = 0;
  marshalStructType[1]._72_8_ = &marshalStructType[1].ChildStructDescriptionCount;
  marshalStructType[1].ChildStructDescription._0_4_ = 0x12;
  memset(&jsonString,0,0x260);
  theStruct.subStruct.u64._6_1_ = 0xc;
  theStruct.subStruct.u64._4_2_ = 0x4d1;
  theStruct.subStruct.u64._0_4_ = 0x3404ccd;
  jsonString = (char *)0xc46cceb3e8ccd;
  theStruct.subStruct.s64._6_1_ = 0x16;
  theStruct.subStruct.s64._4_2_ = 0xf747;
  theStruct.subStruct.s64._0_4_ = 0xd8fc6d33;
  theStruct.subStruct.u32 = 0x231f0ccd;
  theStruct.subStruct.u16 = 0xa46;
  theStruct.subStruct.u8 = '\x1e';
  theStruct.subStruct._15_1_ = 0;
  theStruct.subStruct.s32 = 0x42c90000;
  theStruct.subStruct.f32 = 0.0;
  theStruct.subStruct._36_4_ = 0x40d4bca0;
  theStruct.subStruct.hex64._0_4_ = 0x12345678;
  theStruct.subStruct.f64 = 3.841412024471731e-226;
  theStruct.subStruct._56_8_ = anon_var_dwarf_f912;
  strcpy((char *)&theStruct.subStruct.string,"smallstr");
  theStruct.subStruct.fixedString[2] = '\x01';
  theStruct.subStruct.fixedString[3] = '\0';
  strcpy(theStruct.subStruct.fixedString + 4,"X123456");
  theStruct.subStruct._96_8_ = anon_var_dwarf_f94b;
  theStruct.subStruct.varBin._0_4_ = 0x14;
  theStruct.subStructArray[3].varBinSize = 2;
  theStruct.subStructArray[3]._116_4_ = 0;
  theStruct.subStructArray[0].u64._6_1_ = 0x11;
  theStruct.subStructArray[0].u64._4_2_ = 0x36e;
  theStruct.subStructArray[0].u64._0_4_ = 0x23c6a5;
  theStruct.subStruct.varBinSize = 0xf3ed3;
  theStruct.subStruct._116_4_ = 0;
  theStruct.subStructArray[0].s64._6_1_ = 0xfb;
  theStruct.subStructArray[0].s64._4_2_ = 0xffdf;
  theStruct.subStructArray[0].s64._0_4_ = 0xd0f07d73;
  theStruct.subStructArray[0].u32 = 0xb74a84cd;
  theStruct.subStructArray[0].u16 = 0x62d4;
  theStruct.subStructArray[0].u8 = '\x04';
  theStruct.subStructArray[0]._15_1_ = 0;
  theStruct.subStructArray[0].s32 = 0x43488000;
  theStruct.subStructArray[0].f32 = 0.0;
  theStruct.subStructArray[0]._36_4_ = 0x40ede650;
  theStruct.subStructArray[0].hex64._0_4_ = 0xa2345678;
  theStruct.subStructArray[0].f64 = -4.448051239349301e-149;
  theStruct.subStructArray[0]._56_8_ = anon_var_dwarf_f956;
  strcpy((char *)&theStruct.subStructArray[0].string,"tiny");
  theStruct.subStructArray[0].fixedString[2] = '\x01';
  theStruct.subStructArray[0].fixedString[3] = '\0';
  strcpy(theStruct.subStructArray[0].fixedString + 4,"ABCDEF");
  theStruct.subStructArray[0]._96_8_ = anon_var_dwarf_f98f;
  theStruct.subStructArray[0].varBin._0_4_ = 10;
  theStruct.subStructArray[1].u64._6_1_ = 0x57;
  theStruct.subStructArray[1].u64._4_2_ = 0x1dfe;
  theStruct.subStructArray[1].u64._0_4_ = 0x97be25;
  theStruct.subStructArray[0].varBinSize = 0x3e76ff3;
  theStruct.subStructArray[0]._116_4_ = 0;
  theStruct.subStructArray[1].s64._6_1_ = 0xf7;
  theStruct.subStructArray[1].s64._4_2_ = 0xfb2f;
  theStruct.subStructArray[1].s64._0_4_ = 0xfffffd9b;
  theStruct.subStructArray[1].u32 = 0xffed2979;
  theStruct.subStructArray[1].u16 = 0xffff;
  theStruct.subStructArray[1].u8 = 0xff;
  theStruct.subStructArray[1]._15_1_ = 0xff;
  theStruct.subStructArray[1].s32 = 0x471c4080;
  theStruct.subStructArray[1].f32 = -1.0842022e-19;
  theStruct.subStructArray[1]._36_4_ = 0x4157c530;
  theStruct.subStructArray[1].hex64._0_4_ = 0xb234b678;
  theStruct.subStructArray[1].f64 = -7.697884927969562e-72;
  theStruct.subStructArray[1]._56_8_ = anon_var_dwarf_f9a6;
  strcpy((char *)&theStruct.subStructArray[1].string,":-)");
  theStruct.subStructArray[1].fixedString[2] = '\x01';
  theStruct.subStructArray[1].fixedString[3] = '\0';
  strcpy(theStruct.subStructArray[1].fixedString + 4,"......");
  theStruct.subStructArray[1]._96_8_ = anon_var_dwarf_f9d3;
  theStruct.subStructArray[1].varBin._0_4_ = 0x1e;
  pcStack_a00 = (char *)0x0;
  JVar2 = JlStructToJsonEx(&jsonString,(JlMarshallElement *)&theStruct.subStructArrayCount,2,2,
                           &stack0xfffffffffffff600);
  newStruct.subStructArrayCount._7_1_ = JVar2 == JL_STATUS_SUCCESS;
  WjTestLib_Assert((_Bool)newStruct.subStructArrayCount._7_1_,
                   "((JL_STATUS)(JlStructToJsonEx( &theStruct, marshalStructType, ( sizeof(marshalStructType) / sizeof((marshalStructType)[0]) ), ((JL_OUTPUT_FLAGS) 0x2 ), &jsonString ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x1f8);
  if ((newStruct.subStructArrayCount._7_1_ & 1) == 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  newStruct.subStructArrayCount._6_1_ = pcStack_a00 != (char *)0x0;
  WjTestLib_Assert((_Bool)newStruct.subStructArrayCount._6_1_,"(jsonString) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x1f9);
  if ((newStruct.subStructArrayCount._6_1_ & 1) == 0) {
    local_c = WJTL_STATUS_FAILED;
  }
  memset(&_result_9,0,0x260);
  JVar2 = JlJsonToStruct(pcStack_a00,(JlMarshallElement *)&theStruct.subStructArrayCount,2,
                         &_result_9,(size_t *)0x0);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( jsonString, marshalStructType, ( sizeof(marshalStructType) / sizeof((marshalStructType)[0]) ), &newStruct, ((void*)0) ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x1fd);
  if (JVar2 != JL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  _Var1 = CompareStructType((StructType *)&jsonString,(StructType *)&_result_9);
  WjTestLib_Assert(_Var1,"CompareStructType( &theStruct, &newStruct )",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x1fe);
  if (!_Var1) {
    local_c = WJTL_STATUS_FAILED;
  }
  JVar2 = JlUnmarshallFreeStructAllocs
                    ((JlMarshallElement *)&theStruct.subStructArrayCount,2,&_result_9);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalStructType, ( sizeof(marshalStructType) / sizeof((marshalStructType)[0]) ), &newStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x200);
  if (JVar2 != JL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  WjTestLib_Free(pcStack_a00);
  JVar2 = JlStructToJsonEx(&jsonString,(JlMarshallElement *)&theStruct.subStructArrayCount,2,0x2e,
                           &stack0xfffffffffffff600);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlStructToJsonEx( &theStruct, marshalStructType, ( sizeof(marshalStructType) / sizeof((marshalStructType)[0]) ), ( ((JL_OUTPUT_FLAGS) 0x4 ) | ((JL_OUTPUT_FLAGS) 0x8 ) | ((JL_OUTPUT_FLAGS) 0x20 ) ) | ((JL_OUTPUT_FLAGS) 0x2 ), &jsonString ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x205);
  if (JVar2 != JL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  Condition = pcStack_a00 != (char *)0x0;
  WjTestLib_Assert(Condition,"(jsonString) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x206);
  if (!Condition) {
    local_c = WJTL_STATUS_FAILED;
  }
  memset(&_result_9,0,0x260);
  JVar2 = JlJsonToStruct(pcStack_a00,(JlMarshallElement *)&theStruct.subStructArrayCount,2,
                         &_result_9,(size_t *)0x0);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( jsonString, marshalStructType, ( sizeof(marshalStructType) / sizeof((marshalStructType)[0]) ), &newStruct, ((void*)0) ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x20a);
  if (JVar2 != JL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  _Var1 = CompareStructType((StructType *)&jsonString,(StructType *)&_result_9);
  WjTestLib_Assert(_Var1,"CompareStructType( &theStruct, &newStruct )",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x20b);
  if (!_Var1) {
    local_c = WJTL_STATUS_FAILED;
  }
  JVar2 = JlUnmarshallFreeStructAllocs
                    ((JlMarshallElement *)&theStruct.subStructArrayCount,2,&_result_9);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalStructType, ( sizeof(marshalStructType) / sizeof((marshalStructType)[0]) ), &newStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestMarshallUnmarshall",0x20d);
  if (JVar2 != JL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  WjTestLib_Free(pcStack_a00);
  return local_c;
}

Assistant:

static
WJTL_STATUS
    TestMarshallUnmarshall
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    JlMarshallElement marshalSubStructType[] =
    {
        JlMarshallUnsigned( SubStructType, u64, "u64" ),
        JlMarshallUnsigned( SubStructType, u32, "u32" ),
        JlMarshallUnsigned( SubStructType, u16, "u16" ),
        JlMarshallUnsigned( SubStructType, u8, "u8" ),
        JlMarshallSigned( SubStructType, s64, "s64" ),
        JlMarshallSigned( SubStructType, s32, "s32" ),
        JlMarshallSigned( SubStructType, s16, "s16" ),
        JlMarshallSigned( SubStructType, s8, "s8" ),
        JlMarshallFloat( SubStructType, f32, "f32" ),
        JlMarshallFloat( SubStructType, f64, "f64" ),
        JlMarshallUnsignedHex( SubStructType, hex64, "hex64" ),
        JlMarshallUnsignedHex( SubStructType, hex32, "hex32" ),
        JlMarshallString( SubStructType, string, "string" ),
        JlMarshallStringFixed( SubStructType, fixedString, "fixedString" ),
        JlMarshallBool( SubStructType, b1, "b1" ),
        JlMarshallBool( SubStructType, b2, "b2" ),
        JlMarshallBinaryFixed( SubStructType, fixedBin, "fixedBin" ),
        JlMarshallBinary( SubStructType, varBin, varBinSize, "varBin" ),
    };

    JlMarshallElement marshalStructType[] =
    {
        JlMarshallStruct( StructType, subStruct, "subStruct", marshalSubStructType, NumElements(marshalSubStructType) ),
        JlMarshallStructFixedArray( StructType, subStructArray, subStructArrayCount, "subStructArray", SubStructType, marshalSubStructType, NumElements(marshalSubStructType) ),
    };

    // Create structure full of data
    StructType theStruct = {{0}};

    theStruct.subStruct.u8 = 12;
    theStruct.subStruct.u16 = 1233;
    theStruct.subStruct.u32 = 54545613;
    theStruct.subStruct.u64 = 3455545654545613;
    theStruct.subStruct.s8 = 22;
    theStruct.subStruct.s16 = -2233;
    theStruct.subStruct.s32 = -654545613;
    theStruct.subStruct.s64 = 8455545654545613;
    theStruct.subStruct.f32 = 100.5;
    theStruct.subStruct.f64 = 21234.5;
    theStruct.subStruct.hex32 = 0x12345678;
    theStruct.subStruct.hex64 = 0x1122334455667788ULL;
    theStruct.subStruct.string = "This is a string to test";
    strcpy( theStruct.subStruct.fixedString, "smallstr" );
    theStruct.subStruct.b1 = true;
    theStruct.subStruct.b2 = false;
    strcpy( (char*)theStruct.subStruct.fixedBin, "X123456" );
    theStruct.subStruct.varBin = (uint8_t*) "12345678901234567890";
    theStruct.subStruct.varBinSize = 20;

    theStruct.subStructArrayCount = 2;

    theStruct.subStructArray[0].u8 = 17;
    theStruct.subStructArray[0].u16 = 878;
    theStruct.subStructArray[0].u32 = 2344613;
    theStruct.subStructArray[0].u64 = 999123;
    theStruct.subStructArray[0].s8 = -5;
    theStruct.subStructArray[0].s16 = -33;
    theStruct.subStructArray[0].s32 = -789545613;
    theStruct.subStructArray[0].s64 = 1234565654545613;
    theStruct.subStructArray[0].f32 = 200.5;
    theStruct.subStructArray[0].f64 = 61234.5;
    theStruct.subStructArray[0].hex32 = 0xA2345678;
    theStruct.subStructArray[0].hex64 = 0xA122334455667788;
    theStruct.subStructArray[0].string = "Also a string TEST";
    strcpy( theStruct.subStructArray[0].fixedString, "tiny" );
    theStruct.subStructArray[0].b1 = true;
    theStruct.subStructArray[0].b2 = false;
    strcpy( (char*)theStruct.subStructArray[0].fixedBin, "ABCDEF" );
    theStruct.subStructArray[0].varBin = (uint8_t*) "AAAAAAAAAA";
    theStruct.subStructArray[0].varBinSize = 10;

    theStruct.subStructArray[1].u8 = 87;
    theStruct.subStructArray[1].u16 = 7678;
    theStruct.subStructArray[1].u32 = 9944613;
    theStruct.subStructArray[1].u64 = 65499123;
    theStruct.subStructArray[1].s8 = -9;
    theStruct.subStructArray[1].s16 = -1233;
    theStruct.subStructArray[1].s32 = -613;
    theStruct.subStructArray[1].s64 = -1234567;
    theStruct.subStructArray[1].f32 = 40000.5;
    theStruct.subStructArray[1].f64 = 6231234.5;
    theStruct.subStructArray[1].hex32 = 0xB234B678;
    theStruct.subStructArray[1].hex64 = 0xB12B33B45B66B788;
    theStruct.subStructArray[1].string = "StringString STRING STRING \"String\"String 'String' String // String";
    strcpy( theStruct.subStructArray[1].fixedString, ":-)" );
    theStruct.subStructArray[1].b1 = true;
    theStruct.subStructArray[1].b2 = false;
    strcpy( (char*)theStruct.subStructArray[1].fixedBin, "......" );
    theStruct.subStructArray[1].varBin = (uint8_t*) "abcdeabcdeabcdeabcdeabcdeabcde";
    theStruct.subStructArray[1].varBinSize = 30;

    // Now marshall and unmarshall via json1 with indent formatting
    char* jsonString = NULL;
    JL_ASSERT_SUCCESS( JlStructToJsonEx(
        &theStruct, marshalStructType, NumElements(marshalStructType), JL_OUTPUT_FLAGS_INDENT, &jsonString ) );
    JL_ASSERT_NOT_NULL( jsonString );

    StructType newStruct = {{0}};
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        jsonString, marshalStructType, NumElements(marshalStructType), &newStruct, NULL ) );
    JL_ASSERT( CompareStructType( &theStruct, &newStruct ) );

    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalStructType, NumElements(marshalStructType), &newStruct ) );
    JlFree( jsonString );

    // Now marshall and unmarshall via json5 with indent formatting
    JL_ASSERT_SUCCESS( JlStructToJsonEx(
        &theStruct, marshalStructType, NumElements(marshalStructType), JL_OUTPUT_FLAGS_JSON5 | JL_OUTPUT_FLAGS_INDENT, &jsonString ) );
    JL_ASSERT_NOT_NULL( jsonString );

    memset( &newStruct, 0, sizeof(newStruct) );
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        jsonString, marshalStructType, NumElements(marshalStructType), &newStruct, NULL ) );
    JL_ASSERT( CompareStructType( &theStruct, &newStruct ) );

    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalStructType, NumElements(marshalStructType), &newStruct ) );
    JlFree( jsonString );

    return TestReturn;
}